

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

void vkb::detail::combine_features(VkPhysicalDeviceFeatures *dest,VkPhysicalDeviceFeatures src)

{
  uint uVar1;
  uint uVar3;
  ulong uVar2;
  uint uVar4;
  uint uVar5;
  
  uVar1 = -(uint)(dest->robustBufferAccess == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->fullDrawIndexUint32 == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->imageCubeArray == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->independentBlend == 0) ^ 0xffffffff;
  dest->robustBufferAccess =
       -uVar1 - ((int)((-(uint)(src.robustBufferAccess == 0) | uVar1) ^ 0xffffffff) >> 0x1f);
  dest->fullDrawIndexUint32 =
       -uVar3 - ((int)((-(uint)(src.fullDrawIndexUint32 == 0) | uVar3) ^ 0xffffffff) >> 0x1f);
  dest->imageCubeArray =
       -uVar4 - ((int)((-(uint)(src.imageCubeArray == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->independentBlend =
       -uVar5 - ((int)((-(uint)(src.independentBlend == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->geometryShader == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->tessellationShader == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->sampleRateShading == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->dualSrcBlend == 0) ^ 0xffffffff;
  dest->geometryShader =
       -uVar1 - ((int)((-(uint)(src.geometryShader == 0) | uVar1) ^ 0xffffffff) >> 0x1f);
  dest->tessellationShader =
       -uVar3 - ((int)((-(uint)(src.tessellationShader == 0) | uVar3) ^ 0xffffffff) >> 0x1f);
  dest->sampleRateShading =
       -uVar4 - ((int)((-(uint)(src.sampleRateShading == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->dualSrcBlend =
       -uVar5 - ((int)((-(uint)(src.dualSrcBlend == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->logicOp == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->multiDrawIndirect == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->drawIndirectFirstInstance == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->depthClamp == 0) ^ 0xffffffff;
  dest->logicOp = -uVar1 - ((int)((-(uint)(src.logicOp == 0) | uVar1) ^ 0xffffffff) >> 0x1f);
  dest->multiDrawIndirect =
       -uVar3 - ((int)((-(uint)(src.multiDrawIndirect == 0) | uVar3) ^ 0xffffffff) >> 0x1f);
  dest->drawIndirectFirstInstance =
       -uVar4 - ((int)((-(uint)(src.drawIndirectFirstInstance == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->depthClamp = -uVar5 - ((int)((-(uint)(src.depthClamp == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->depthBiasClamp == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->fillModeNonSolid == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->depthBounds == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->wideLines == 0) ^ 0xffffffff;
  dest->depthBiasClamp =
       -uVar1 - ((int)((-(uint)(src.depthBiasClamp == 0) | uVar1) ^ 0xffffffff) >> 0x1f);
  dest->fillModeNonSolid =
       -uVar3 - ((int)((-(uint)(src.fillModeNonSolid == 0) | uVar3) ^ 0xffffffff) >> 0x1f);
  dest->depthBounds = -uVar4 - ((int)((-(uint)(src.depthBounds == 0) | uVar4) ^ 0xffffffff) >> 0x1f)
  ;
  dest->wideLines = -uVar5 - ((int)((-(uint)(src.wideLines == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->largePoints == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->alphaToOne == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->multiViewport == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->samplerAnisotropy == 0) ^ 0xffffffff;
  dest->largePoints = -uVar1 - ((int)((-(uint)(src.largePoints == 0) | uVar1) ^ 0xffffffff) >> 0x1f)
  ;
  dest->alphaToOne = -uVar3 - ((int)((-(uint)(src.alphaToOne == 0) | uVar3) ^ 0xffffffff) >> 0x1f);
  dest->multiViewport =
       -uVar4 - ((int)((-(uint)(src.multiViewport == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->samplerAnisotropy =
       -uVar5 - ((int)((-(uint)(src.samplerAnisotropy == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->textureCompressionETC2 == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->textureCompressionASTC_LDR == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->textureCompressionBC == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->occlusionQueryPrecise == 0) ^ 0xffffffff;
  dest->textureCompressionETC2 =
       -uVar1 - ((int)((-(uint)(src.textureCompressionETC2 == 0) | uVar1) ^ 0xffffffff) >> 0x1f);
  dest->textureCompressionASTC_LDR =
       -uVar3 - ((int)((-(uint)(src.textureCompressionASTC_LDR == 0) | uVar3) ^ 0xffffffff) >> 0x1f)
  ;
  dest->textureCompressionBC =
       -uVar4 - ((int)((-(uint)(src.textureCompressionBC == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->occlusionQueryPrecise =
       -uVar5 - ((int)((-(uint)(src.occlusionQueryPrecise == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->pipelineStatisticsQuery == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->vertexPipelineStoresAndAtomics == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->fragmentStoresAndAtomics == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->shaderTessellationAndGeometryPointSize == 0) ^ 0xffffffff;
  dest->pipelineStatisticsQuery =
       -uVar1 - ((int)((-(uint)(src.pipelineStatisticsQuery == 0) | uVar1) ^ 0xffffffff) >> 0x1f);
  dest->vertexPipelineStoresAndAtomics =
       -uVar3 - ((int)((-(uint)(src.vertexPipelineStoresAndAtomics == 0) | uVar3) ^ 0xffffffff) >>
                0x1f);
  dest->fragmentStoresAndAtomics =
       -uVar4 - ((int)((-(uint)(src.fragmentStoresAndAtomics == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->shaderTessellationAndGeometryPointSize =
       -uVar5 - ((int)((-(uint)(src.shaderTessellationAndGeometryPointSize == 0) | uVar5) ^
                      0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->shaderImageGatherExtended == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->shaderStorageImageExtendedFormats == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->shaderStorageImageMultisample == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->shaderStorageImageReadWithoutFormat == 0) ^ 0xffffffff;
  dest->shaderImageGatherExtended =
       -uVar1 - ((int)((-(uint)(src.shaderImageGatherExtended == 0) | uVar1) ^ 0xffffffff) >> 0x1f);
  dest->shaderStorageImageExtendedFormats =
       -uVar3 - ((int)((-(uint)(src.shaderStorageImageExtendedFormats == 0) | uVar3) ^ 0xffffffff)
                >> 0x1f);
  dest->shaderStorageImageMultisample =
       -uVar4 - ((int)((-(uint)(src.shaderStorageImageMultisample == 0) | uVar4) ^ 0xffffffff) >>
                0x1f);
  dest->shaderStorageImageReadWithoutFormat =
       -uVar5 - ((int)((-(uint)(src.shaderStorageImageReadWithoutFormat == 0) | uVar5) ^ 0xffffffff)
                >> 0x1f);
  uVar1 = -(uint)(dest->shaderStorageImageWriteWithoutFormat == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->shaderUniformBufferArrayDynamicIndexing == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->shaderSampledImageArrayDynamicIndexing == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->shaderStorageBufferArrayDynamicIndexing == 0) ^ 0xffffffff;
  dest->shaderStorageImageWriteWithoutFormat =
       -uVar1 - ((int)((-(uint)(src.shaderStorageImageWriteWithoutFormat == 0) | uVar1) ^ 0xffffffff
                      ) >> 0x1f);
  dest->shaderUniformBufferArrayDynamicIndexing =
       -uVar3 - ((int)((-(uint)(src.shaderUniformBufferArrayDynamicIndexing == 0) | uVar3) ^
                      0xffffffff) >> 0x1f);
  dest->shaderSampledImageArrayDynamicIndexing =
       -uVar4 - ((int)((-(uint)(src.shaderSampledImageArrayDynamicIndexing == 0) | uVar4) ^
                      0xffffffff) >> 0x1f);
  dest->shaderStorageBufferArrayDynamicIndexing =
       -uVar5 - ((int)((-(uint)(src.shaderStorageBufferArrayDynamicIndexing == 0) | uVar5) ^
                      0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->shaderStorageImageArrayDynamicIndexing == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->shaderClipDistance == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->shaderCullDistance == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->shaderFloat64 == 0) ^ 0xffffffff;
  dest->shaderStorageImageArrayDynamicIndexing =
       -uVar1 - ((int)((-(uint)(src.shaderStorageImageArrayDynamicIndexing == 0) | uVar1) ^
                      0xffffffff) >> 0x1f);
  dest->shaderClipDistance =
       -uVar3 - ((int)((-(uint)(src.shaderClipDistance == 0) | uVar3) ^ 0xffffffff) >> 0x1f);
  dest->shaderCullDistance =
       -uVar4 - ((int)((-(uint)(src.shaderCullDistance == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->shaderFloat64 =
       -uVar5 - ((int)((-(uint)(src.shaderFloat64 == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->shaderInt64 == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->shaderInt16 == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->shaderResourceResidency == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->shaderResourceMinLod == 0) ^ 0xffffffff;
  dest->shaderInt64 = -uVar1 - ((int)((-(uint)(src.shaderInt64 == 0) | uVar1) ^ 0xffffffff) >> 0x1f)
  ;
  dest->shaderInt16 = -uVar3 - ((int)((-(uint)(src.shaderInt16 == 0) | uVar3) ^ 0xffffffff) >> 0x1f)
  ;
  dest->shaderResourceResidency =
       -uVar4 - ((int)((-(uint)(src.shaderResourceResidency == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->shaderResourceMinLod =
       -uVar5 - ((int)((-(uint)(src.shaderResourceMinLod == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->sparseBinding == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->sparseResidencyBuffer == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->sparseResidencyImage2D == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->sparseResidencyImage3D == 0) ^ 0xffffffff;
  dest->sparseBinding =
       -uVar1 - ((int)((-(uint)(src.sparseBinding == 0) | uVar1) ^ 0xffffffff) >> 0x1f);
  dest->sparseResidencyBuffer =
       -uVar3 - ((int)((-(uint)(src.sparseResidencyBuffer == 0) | uVar3) ^ 0xffffffff) >> 0x1f);
  dest->sparseResidencyImage2D =
       -uVar4 - ((int)((-(uint)(src.sparseResidencyImage2D == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->sparseResidencyImage3D =
       -uVar5 - ((int)((-(uint)(src.sparseResidencyImage3D == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar1 = -(uint)(dest->sparseResidency2Samples == 0) ^ 0xffffffff;
  uVar3 = -(uint)(dest->sparseResidency4Samples == 0) ^ 0xffffffff;
  uVar4 = -(uint)(dest->sparseResidency8Samples == 0) ^ 0xffffffff;
  uVar5 = -(uint)(dest->sparseResidency16Samples == 0) ^ 0xffffffff;
  dest->sparseResidency2Samples =
       -uVar1 - ((int)((-(uint)(src.sparseResidency2Samples == 0) | uVar1) ^ 0xffffffff) >> 0x1f);
  dest->sparseResidency4Samples =
       -uVar3 - ((int)((-(uint)(src.sparseResidency4Samples == 0) | uVar3) ^ 0xffffffff) >> 0x1f);
  dest->sparseResidency8Samples =
       -uVar4 - ((int)((-(uint)(src.sparseResidency8Samples == 0) | uVar4) ^ 0xffffffff) >> 0x1f);
  dest->sparseResidency16Samples =
       -uVar5 - ((int)((-(uint)(src.sparseResidency16Samples == 0) | uVar5) ^ 0xffffffff) >> 0x1f);
  uVar2._0_4_ = dest->sparseResidencyAliased;
  uVar2._4_4_ = dest->variableMultisampleRate;
  uVar2 = ~CONCAT44(-(uint)((int)((src._208_8_ | uVar2) >> 0x20) == 0),
                    -(uint)((int)(src._208_8_ | uVar2) == 0)) & (ulong)DAT_00115270;
  dest->sparseResidencyAliased = (int)uVar2;
  dest->variableMultisampleRate = (int)(uVar2 >> 0x20);
  dest->inheritedQueries = (uint)(src.inheritedQueries != 0 || dest->inheritedQueries != 0);
  return;
}

Assistant:

void combine_features(VkPhysicalDeviceFeatures& dest, VkPhysicalDeviceFeatures src){
    dest.robustBufferAccess = dest.robustBufferAccess || src.robustBufferAccess;
	dest.fullDrawIndexUint32 = dest.fullDrawIndexUint32 || src.fullDrawIndexUint32;
	dest.imageCubeArray = dest.imageCubeArray || src.imageCubeArray;
	dest.independentBlend = dest.independentBlend || src.independentBlend;
	dest.geometryShader = dest.geometryShader || src.geometryShader;
	dest.tessellationShader = dest.tessellationShader || src.tessellationShader;
	dest.sampleRateShading = dest.sampleRateShading || src.sampleRateShading;
	dest.dualSrcBlend = dest.dualSrcBlend || src.dualSrcBlend;
	dest.logicOp = dest.logicOp || src.logicOp;
	dest.multiDrawIndirect = dest.multiDrawIndirect || src.multiDrawIndirect;
	dest.drawIndirectFirstInstance = dest.drawIndirectFirstInstance || src.drawIndirectFirstInstance;
	dest.depthClamp = dest.depthClamp || src.depthClamp;
	dest.depthBiasClamp = dest.depthBiasClamp || src.depthBiasClamp;
	dest.fillModeNonSolid = dest.fillModeNonSolid || src.fillModeNonSolid;
	dest.depthBounds = dest.depthBounds || src.depthBounds;
	dest.wideLines = dest.wideLines || src.wideLines;
	dest.largePoints = dest.largePoints || src.largePoints;
	dest.alphaToOne = dest.alphaToOne || src.alphaToOne;
	dest.multiViewport = dest.multiViewport || src.multiViewport;
	dest.samplerAnisotropy = dest.samplerAnisotropy || src.samplerAnisotropy;
	dest.textureCompressionETC2 = dest.textureCompressionETC2 || src.textureCompressionETC2;
	dest.textureCompressionASTC_LDR = dest.textureCompressionASTC_LDR || src.textureCompressionASTC_LDR;
	dest.textureCompressionBC = dest.textureCompressionBC || src.textureCompressionBC;
	dest.occlusionQueryPrecise = dest.occlusionQueryPrecise || src.occlusionQueryPrecise;
	dest.pipelineStatisticsQuery = dest.pipelineStatisticsQuery || src.pipelineStatisticsQuery;
	dest.vertexPipelineStoresAndAtomics = dest.vertexPipelineStoresAndAtomics || src.vertexPipelineStoresAndAtomics;
	dest.fragmentStoresAndAtomics = dest.fragmentStoresAndAtomics || src.fragmentStoresAndAtomics;
	dest.shaderTessellationAndGeometryPointSize = dest.shaderTessellationAndGeometryPointSize || src.shaderTessellationAndGeometryPointSize;
	dest.shaderImageGatherExtended = dest.shaderImageGatherExtended || src.shaderImageGatherExtended;
	dest.shaderStorageImageExtendedFormats = dest.shaderStorageImageExtendedFormats || src.shaderStorageImageExtendedFormats;
	dest.shaderStorageImageMultisample = dest.shaderStorageImageMultisample || src.shaderStorageImageMultisample;
	dest.shaderStorageImageReadWithoutFormat = dest.shaderStorageImageReadWithoutFormat || src.shaderStorageImageReadWithoutFormat;
	dest.shaderStorageImageWriteWithoutFormat = dest.shaderStorageImageWriteWithoutFormat || src.shaderStorageImageWriteWithoutFormat;
	dest.shaderUniformBufferArrayDynamicIndexing = dest.shaderUniformBufferArrayDynamicIndexing || src.shaderUniformBufferArrayDynamicIndexing;
	dest.shaderSampledImageArrayDynamicIndexing = dest.shaderSampledImageArrayDynamicIndexing || src.shaderSampledImageArrayDynamicIndexing;
	dest.shaderStorageBufferArrayDynamicIndexing = dest.shaderStorageBufferArrayDynamicIndexing || src.shaderStorageBufferArrayDynamicIndexing;
	dest.shaderStorageImageArrayDynamicIndexing = dest.shaderStorageImageArrayDynamicIndexing || src.shaderStorageImageArrayDynamicIndexing;
	dest.shaderClipDistance = dest.shaderClipDistance || src.shaderClipDistance;
	dest.shaderCullDistance = dest.shaderCullDistance || src.shaderCullDistance;
	dest.shaderFloat64 = dest.shaderFloat64 || src.shaderFloat64;
	dest.shaderInt64 = dest.shaderInt64 || src.shaderInt64;
	dest.shaderInt16 = dest.shaderInt16 || src.shaderInt16;
	dest.shaderResourceResidency = dest.shaderResourceResidency || src.shaderResourceResidency;
	dest.shaderResourceMinLod = dest.shaderResourceMinLod || src.shaderResourceMinLod;
	dest.sparseBinding = dest.sparseBinding || src.sparseBinding;
	dest.sparseResidencyBuffer = dest.sparseResidencyBuffer || src.sparseResidencyBuffer;
	dest.sparseResidencyImage2D = dest.sparseResidencyImage2D || src.sparseResidencyImage2D;
	dest.sparseResidencyImage3D = dest.sparseResidencyImage3D || src.sparseResidencyImage3D;
	dest.sparseResidency2Samples = dest.sparseResidency2Samples || src.sparseResidency2Samples;
	dest.sparseResidency4Samples = dest.sparseResidency4Samples || src.sparseResidency4Samples;
	dest.sparseResidency8Samples = dest.sparseResidency8Samples || src.sparseResidency8Samples;
	dest.sparseResidency16Samples = dest.sparseResidency16Samples || src.sparseResidency16Samples;
	dest.sparseResidencyAliased = dest.sparseResidencyAliased || src.sparseResidencyAliased;
	dest.variableMultisampleRate = dest.variableMultisampleRate || src.variableMultisampleRate;
	dest.inheritedQueries = dest.inheritedQueries || src.inheritedQueries;
}